

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FoundationPileTests.cpp
# Opt level: O0

void __thiscall
solitaire::piles::EmptyFoundationPileTest_tryAddAce_Test::EmptyFoundationPileTest_tryAddAce_Test
          (EmptyFoundationPileTest_tryAddAce_Test *this)

{
  EmptyFoundationPileTest_tryAddAce_Test *this_local;
  
  EmptyFoundationPileTest::EmptyFoundationPileTest(&this->super_EmptyFoundationPileTest);
  (this->super_EmptyFoundationPileTest).super_Test._vptr_Test =
       (_func_int **)&PTR__EmptyFoundationPileTest_tryAddAce_Test_00509848;
  return;
}

Assistant:

TEST_F(EmptyFoundationPileTest, tryAddAce) {
    const Cards pileCards {
        Card {Value::Ace, Suit::Heart}
    };

    std::optional<Card> cardToAdd = pileCards.front();

    pile->tryAddCard(cardToAdd);

    EXPECT_EQ(cardToAdd, std::nullopt);
    EXPECT_THAT(pile->getCards(), ContainerEq(pileCards));
    EXPECT_EQ(pile->getTopCardValue(), Value::Ace);
}